

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  sel_t sVar11;
  ulong uVar12;
  long lVar13;
  idx_t iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (count + 0x3f < 0x40) {
    iVar14 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar14 = 0;
    uVar6 = 0;
    uVar18 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[uVar6];
      }
      uVar12 = uVar18 + 0x40;
      if (count <= uVar18 + 0x40) {
        uVar12 = count;
      }
      uVar17 = uVar12;
      if (uVar7 != 0) {
        uVar17 = uVar18;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar18 < uVar12) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar18 = uVar18 << 4 | 8;
            do {
              uVar7 = uVar17;
              if (psVar2 != (sel_t *)0x0) {
                uVar7 = (ulong)psVar2[uVar17];
              }
              lVar4 = *(long *)((long)&ldata->months + uVar18);
              lVar8 = (long)*(int *)((long)ldata + (uVar18 - 4)) + lVar4 / 86400000000;
              lVar10 = lVar8 % 0x1e;
              lVar16 = (long)*(int *)((long)ldata + (uVar18 - 8)) + lVar8 / 0x1e;
              lVar8 = *(long *)((long)&rdata->months + uVar18);
              lVar9 = (long)*(int *)((long)rdata + (uVar18 - 4)) + lVar8 / 86400000000;
              lVar13 = lVar9 % 0x1e;
              lVar9 = (long)*(int *)((long)rdata + (uVar18 - 8)) + lVar9 / 0x1e;
              uVar5 = 1;
              if (lVar16 <= lVar9) {
                if (lVar16 < lVar9) {
                  uVar5 = 0;
                }
                else if (lVar10 <= lVar13) {
                  uVar5 = (ulong)(lVar8 % 86400000000 < lVar4 % 86400000000 && lVar13 <= lVar10);
                }
              }
              psVar3[iVar14] = (sel_t)uVar7;
              iVar14 = iVar14 + uVar5;
              uVar17 = uVar17 + 1;
              uVar18 = uVar18 + 0x10;
            } while (uVar12 != uVar17);
          }
        }
        else if (uVar18 < uVar12) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          uVar17 = uVar18 << 4 | 8;
          uVar5 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar11 = (int)uVar18 + (int)uVar5;
            }
            else {
              sVar11 = psVar2[uVar18 + uVar5];
            }
            if ((uVar7 >> (uVar5 & 0x3f) & 1) == 0) {
              uVar15 = 0;
            }
            else {
              lVar4 = *(long *)((long)&ldata->months + uVar17);
              lVar8 = (long)*(int *)((long)ldata + (uVar17 - 4)) + lVar4 / 86400000000;
              lVar10 = lVar8 % 0x1e;
              lVar16 = (long)*(int *)((long)ldata + (uVar17 - 8)) + lVar8 / 0x1e;
              lVar8 = *(long *)((long)&rdata->months + uVar17);
              lVar13 = (long)*(int *)((long)rdata + (uVar17 - 4)) + lVar8 / 86400000000;
              lVar9 = lVar13 % 0x1e;
              lVar13 = (long)*(int *)((long)rdata + (uVar17 - 8)) + lVar13 / 0x1e;
              uVar15 = 1;
              if (lVar16 <= lVar13) {
                if (lVar16 < lVar13) {
                  uVar15 = 0;
                }
                else if (lVar10 <= lVar9) {
                  uVar15 = (ulong)(lVar8 % 86400000000 < lVar4 % 86400000000 && lVar9 <= lVar10);
                }
              }
            }
            psVar3[iVar14] = sVar11;
            iVar14 = uVar15 + iVar14;
            uVar5 = uVar5 + 1;
            uVar17 = uVar17 + 0x10;
          } while ((uVar18 - uVar12) + uVar5 != 0);
          uVar17 = uVar18 + uVar5;
        }
      }
      uVar6 = uVar6 + 1;
      uVar18 = uVar17;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return iVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}